

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall smf::MidiMessage::setCommandNibble(MidiMessage *this,int value)

{
  byte bVar1;
  size_type sVar2;
  byte *pbVar3;
  int value_local;
  MidiMessage *this_local;
  
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
  if (sVar2 == 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,1);
  }
  if (value < 0x10) {
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
    bVar1 = *pbVar3;
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
    *pbVar3 = bVar1 & 0xf | (byte)((value & 0xfU) << 4);
  }
  else {
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
    bVar1 = *pbVar3;
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
    *pbVar3 = bVar1 & 0xf | (byte)value & 0xf0;
  }
  return;
}

Assistant:

void MidiMessage::setCommandNibble(int value) {
	if (this->size() < 1) {
		this->resize(1);
	}
	if (value <= 0x0f) {
		(*this)[0] = ((*this)[0] & 0x0f) | ((uchar)((value << 4) & 0xf0));
	} else {
		(*this)[0] = ((*this)[0] & 0x0f) | ((uchar)(value & 0xf0));
	}
}